

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O1

int labldef(int lval,int flag)

{
  t_symbol *ptVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  
  ptVar1 = lablptr;
  iVar2 = page;
  if (lablptr == (t_symbol *)0x0) {
    return 0;
  }
  uVar6 = page << 0xd | lval & 0x1fffU;
  if (flag == 0) {
    uVar6 = lval;
  }
  if (pass == 0) {
    switch(lablptr->type) {
    case 1:
      lablptr->type = 4;
      ptVar1->value = uVar6;
LAB_001129cb:
      iVar3 = section;
      if (flag == 0) {
        return 0;
      }
      if (section == 2) {
        ptVar1->proc = proc_ptr;
      }
      iVar4 = 0;
      if (1 < (uint)iVar3) {
        iVar4 = bank_base;
      }
      ptVar1->bank = iVar4 + bank;
      ptVar1->page = iVar2;
      if ((ptVar1->name[1] == '@') || (ptVar1->name[1] == '.')) {
        lastlabl = (t_symbol *)0x0;
      }
      else {
        glablptr = ptVar1;
        lastlabl = ptVar1;
      }
      return 0;
    case 2:
      pcVar5 = "Can not define this label, declared as undefined in an IF expression!";
      break;
    default:
      if (lablptr->reserved != 0) {
        pcVar5 = "Reserved symbol!";
        goto LAB_00112998;
      }
      if (lablptr->value == uVar6) goto LAB_001129cb;
      ptVar1->type = 3;
      ptVar1->value = 0;
      pcVar5 = "Label multiply defined!";
      break;
    case 5:
      pcVar5 = "Symbol already used by a macro!";
      break;
    case 6:
      pcVar5 = "Symbol already used by a function!";
    }
    error(pcVar5);
  }
  else {
    if (lablptr->value == uVar6) {
      if (flag == 0) {
        return 0;
      }
      if ((bank_limit <= bank) || (lablptr->bank == bank + bank_base)) goto LAB_001129cb;
    }
    pcVar5 = "Internal error[1]!";
LAB_00112998:
    fatal_error(pcVar5);
  }
  return -1;
}

Assistant:

int
labldef(int lval, int flag)
{
	char c;

	/* check for NULL ptr */
	if (lablptr == NULL)
		return (0);

	/* adjust symbol address */
	if (flag)
		lval = (lval & 0x1FFF) | (page << 13);

	/* first pass */
	if (pass == FIRST_PASS) {
		switch (lablptr->type) {
		/* undefined */
		case UNDEF:
			lablptr->type = DEFABS;
			lablptr->value = lval;
			break;

		/* already defined - error */
		case IFUNDEF:
			error("Can not define this label, declared as undefined in an IF expression!");
			return (-1);

		case MACRO:
			error("Symbol already used by a macro!");
			return (-1);

		case FUNC:
			error("Symbol already used by a function!");
			return (-1);

		default:
			/* reserved label */
			if (lablptr->reserved) {
				fatal_error("Reserved symbol!");
				return (-1);
			}

			/* compare the values */
			if (lablptr->value == lval)
				break;

			/* normal label */
			lablptr->type = MDEF;
			lablptr->value = 0;
			error("Label multiply defined!");
			return (-1);
		}
	}

	/* second pass */
	else {
		if ((lablptr->value != lval) ||
		   ((flag) && (bank < bank_limit) && (lablptr->bank  != bank_base + bank)))
		{
			fatal_error("Internal error[1]!");
			return (-1);
		}
	}

	/* update symbol data */
	if (flag) {
		if (section == S_CODE)
			lablptr->proc = proc_ptr;

		if ((section == S_BSS) || (section == S_ZP))
		{
			lablptr->bank = bank;
		} else {
			lablptr->bank = bank_base + bank;
		}
		lablptr->page = page;

		/* check if it's a local or global symbol */
		c = lablptr->name[1];
		if (c == '.' || c == '@')
			/* local */
			lastlabl = NULL;
		else {
			/* global */
			glablptr = lablptr;
			lastlabl = lablptr;
		}
	}

	/* ok */
	return (0);
}